

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slaset.c
# Opt level: O3

int slaset_slu(char *uplo,int *m,int *n,float *alpha,float *beta,float *a,int *lda)

{
  float fVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  
  if (*uplo == 'U') {
    if (1 < *n) {
      iVar6 = *m;
      iVar3 = *n;
      iVar7 = 1;
      iVar5 = 2;
      do {
        iVar8 = iVar5 + -1;
        if (iVar6 < iVar5) {
          iVar8 = iVar6;
        }
        if (0 < iVar8) {
          fVar1 = *alpha;
          iVar8 = *lda;
          iVar2 = iVar5 + -1;
          if (*m < iVar5) {
            iVar2 = *m;
          }
          lVar10 = 0;
          do {
            a[(long)iVar7 * (long)iVar8 + lVar10] = fVar1;
            lVar10 = lVar10 + 1;
          } while ((int)lVar10 < iVar2);
        }
        iVar7 = iVar7 + 1;
        bVar4 = iVar5 < iVar3;
        iVar5 = iVar5 + 1;
      } while (bVar4);
    }
  }
  else if (*uplo == 'L') {
    iVar6 = *n;
    if (*m < *n) {
      iVar6 = *m;
    }
    if (0 < iVar6) {
      iVar6 = *m;
      iVar3 = *n;
      if (iVar6 < *n) {
        iVar3 = iVar6;
      }
      iVar7 = 0;
      iVar5 = 1;
      do {
        if (iVar5 < iVar6) {
          fVar1 = *alpha;
          iVar8 = *m;
          iVar2 = *lda;
          iVar9 = iVar5;
          do {
            a[iVar2 * iVar7 + iVar9] = fVar1;
            iVar9 = iVar9 + 1;
          } while (iVar9 < iVar8);
        }
        iVar7 = iVar7 + 1;
        bVar4 = iVar5 < iVar3;
        iVar5 = iVar5 + 1;
      } while (bVar4);
    }
  }
  else if (0 < *n) {
    iVar6 = *m;
    iVar3 = *n;
    iVar7 = 0;
    iVar5 = 1;
    do {
      if (0 < iVar6) {
        fVar1 = *alpha;
        iVar8 = *lda;
        iVar2 = *m;
        lVar10 = 0;
        do {
          a[(long)iVar7 * (long)iVar8 + lVar10] = fVar1;
          lVar10 = lVar10 + 1;
        } while ((int)lVar10 < iVar2);
      }
      iVar7 = iVar7 + 1;
      bVar4 = iVar5 < iVar3;
      iVar5 = iVar5 + 1;
    } while (bVar4);
  }
  iVar6 = *n;
  if (*m < *n) {
    iVar6 = *m;
  }
  if (0 < iVar6) {
    fVar1 = *beta;
    iVar6 = *lda;
    iVar3 = *n;
    if (*m < *n) {
      iVar3 = *m;
    }
    iVar5 = 0;
    iVar7 = 0;
    do {
      a[iVar5] = fVar1;
      iVar7 = iVar7 + 1;
      iVar5 = iVar5 + iVar6 + 1;
    } while (iVar7 < iVar3);
  }
  return 0;
}

Assistant:

int slaset_slu(char *uplo, int *m, int *n, float *alpha,
	float *beta, float *a, int *lda)
{
/*  -- LAPACK auxiliary routine (version 2.0) --   
       Univ. of Tennessee, Univ. of California Berkeley, NAG Ltd.,   
       Courant Institute, Argonne National Lab, and Rice University   
       October 31, 1992   


    Purpose   
    =======   

    SLASET initializes an m-by-n matrix A to BETA on the diagonal and   
    ALPHA on the offdiagonals.   

    Arguments   
    =========   

    UPLO    (input) CHARACTER*1   
            Specifies the part of the matrix A to be set.   
            = 'U':      Upper triangular part is set; the strictly lower 
  
                        triangular part of A is not changed.   
            = 'L':      Lower triangular part is set; the strictly upper 
  
                        triangular part of A is not changed.   
            Otherwise:  All of the matrix A is set.   

    M       (input) INTEGER   
            The number of rows of the matrix A.  M >= 0.   

    N       (input) INTEGER   
            The number of columns of the matrix A.  N >= 0.   

    ALPHA   (input) REAL   
            The constant to which the offdiagonal elements are to be set. 
  

    BETA    (input) REAL   
            The constant to which the diagonal elements are to be set.   

    A       (input/output) REAL array, dimension (LDA,N)   
            On exit, the leading m-by-n submatrix of A is set as follows: 
  

            if UPLO = 'U', A(i,j) = ALPHA, 1<=i<=j-1, 1<=j<=n,   
            if UPLO = 'L', A(i,j) = ALPHA, j+1<=i<=m, 1<=j<=n,   
            otherwise,     A(i,j) = ALPHA, 1<=i<=m, 1<=j<=n, i.ne.j,   

            and, for all UPLO, A(i,i) = BETA, 1<=i<=min(m,n).   

    LDA     (input) INTEGER   
            The leading dimension of the array A.  LDA >= max(1,M).   

   ===================================================================== 
  


    
   Parameter adjustments   
       Function Body */
    /* System generated locals */
    /* Local variables */
    static int i, j;


#define A(I,J) a[(I)-1 + ((J)-1)* ( *lda)]

    if (strncmp(uplo, "U", 1)==0) {

/*        Set the strictly upper triangular or trapezoidal part of the
   
          array to ALPHA. */

	for (j = 2; j <= *n; ++j) {
/* Computing MIN */
	    for (i = 1; i <= SUPERLU_MIN(j-1,*m); ++i) {
		A(i,j) = *alpha;
/* L10: */
	    }
/* L20: */
	}

    } else if (strncmp(uplo, "L", 1)==0) {

/*        Set the strictly lower triangular or trapezoidal part of the
   
          array to ALPHA. */

	for (j = 1; j <= SUPERLU_MIN(*m,*n); ++j) {
	    for (i = j + 1; i <= *m; ++i) {
		A(i,j) = *alpha;
/* L30: */
	    }
/* L40: */
	}

    } else {

/*        Set the leading m-by-n submatrix to ALPHA. */

	for (j = 1; j <= *n; ++j) {
	    for (i = 1; i <= *m; ++i) {
		A(i,j) = *alpha;
/* L50: */
	    }
/* L60: */
	}
    }

/*     Set the first SUPERLU_MIN(M,N) diagonal elements to BETA. */

    for (i = 1; i <= SUPERLU_MIN(*m,*n); ++i) {
	A(i,i) = *beta;
/* L70: */
    }

    return 0;

/*     End of SLASET */

}